

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

dxt_image * __thiscall crnlib::dxt_image::operator=(dxt_image *this,dxt_image *rhs)

{
  uint min_new_capacity;
  uint uVar1;
  
  if (this != rhs) {
    clear(this);
    this->m_width = rhs->m_width;
    this->m_height = rhs->m_height;
    this->m_blocks_x = rhs->m_blocks_x;
    this->m_blocks_y = rhs->m_blocks_y;
    this->m_num_elements_per_block = rhs->m_num_elements_per_block;
    this->m_bytes_per_block = rhs->m_bytes_per_block;
    this->m_format = rhs->m_format;
    this->m_total_blocks = rhs->m_total_blocks;
    min_new_capacity = rhs->m_total_elements;
    this->m_total_elements = min_new_capacity;
    this->m_pElements = (element *)0x0;
    *(undefined8 *)this->m_element_type = *(undefined8 *)rhs->m_element_type;
    *(undefined2 *)this->m_element_component_index = *(undefined2 *)rhs->m_element_component_index;
    if (rhs->m_pElements != (element *)0x0) {
      uVar1 = (this->m_elements).m_size;
      if (uVar1 != min_new_capacity) {
        if ((uVar1 <= min_new_capacity) && ((this->m_elements).m_capacity < min_new_capacity)) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this,min_new_capacity,uVar1 + 1 == min_new_capacity,8,
                     (object_mover)0x0,false);
        }
        (this->m_elements).m_size = min_new_capacity;
      }
      memcpy((this->m_elements).m_p,rhs->m_pElements,(ulong)this->m_total_elements << 3);
      this->m_pElements = (this->m_elements).m_p;
    }
  }
  return this;
}

Assistant:

dxt_image& dxt_image::operator=(const dxt_image& rhs) {
  if (this == &rhs)
    return *this;

  clear();

  m_width = rhs.m_width;
  m_height = rhs.m_height;
  m_blocks_x = rhs.m_blocks_x;
  m_blocks_y = rhs.m_blocks_y;
  m_num_elements_per_block = rhs.m_num_elements_per_block;
  m_bytes_per_block = rhs.m_bytes_per_block;
  m_format = rhs.m_format;
  m_total_blocks = rhs.m_total_blocks;
  m_total_elements = rhs.m_total_elements;
  m_pElements = NULL;
  memcpy(m_element_type, rhs.m_element_type, sizeof(m_element_type));
  memcpy(m_element_component_index, rhs.m_element_component_index, sizeof(m_element_component_index));

  if (rhs.m_pElements) {
    m_elements.resize(m_total_elements);
    memcpy(&m_elements[0], rhs.m_pElements, sizeof(element) * m_total_elements);
    m_pElements = &m_elements[0];
  }

  return *this;
}